

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O3

filtration_entry_t __thiscall
priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
::pop_pivot(priority_queue_t<std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            *this)

{
  unordered_map<int,_bool,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  *puVar1;
  _Map_pointer ppfVar2;
  pair<float,_int> *ppVar3;
  _Node_iterator_base<std::pair<const_int,_bool>,_false> __it;
  iterator iVar4;
  _Elt_pointer pfVar5;
  pair<float,_int> pVar6;
  filtration_entry_t *pfVar7;
  uint uVar8;
  ulong uVar9;
  uint local_3c;
  pair<float,_int> local_38;
  
  if ((this->use_dense_version == true) &&
     (ppfVar2 = (this->
                super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node,
     pfVar5 = (this->
              super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
              .super__Deque_impl_data._M_start._M_cur,
     ((long)(this->
            super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_start._M_last - (long)pfVar5 >> 3) +
     ((long)(this->
            super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur -
      (long)(this->
            super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
            ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
            super__Deque_impl_data._M_finish._M_first >> 3) +
     ((((ulong)((long)ppfVar2 -
               (long)(this->
                     super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                     ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                     _M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
     (ulong)(ppfVar2 == (_Map_pointer)0x0)) * 0x40 != 0)) {
    puVar1 = &this->coefficients;
    local_38.first = (float)(pfVar5->super_pair<float,_int>).second;
    __it._M_cur = (__node_type *)
                  std::
                  _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&puVar1->_M_h,(key_type_conflict *)&local_38);
    if (__it._M_cur != (__node_type *)0x0) {
      do {
        if (((__it._M_cur)->super__Hash_node_value<std::pair<const_int,_bool>,_false>).
            super__Hash_node_value_base<std::pair<const_int,_bool>_>._M_storage._M_storage.__data[4]
            != '\0') break;
        std::
        _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&puVar1->_M_h,(const_iterator)__it._M_cur);
        std::
        priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ::pop(&this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             );
        local_38.first =
             (float)(((this->
                      super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                      ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur)->super_pair<float,_int>).
                    second;
        __it._M_cur = (__node_type *)
                      std::
                      _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&puVar1->_M_h,(key_type_conflict *)&local_38);
      } while (__it._M_cur != (__node_type *)0x0);
    }
  }
  ppVar3 = &((this->
             super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur)->super_pair<float,_int>;
  pVar6 = dummy.super_pair<float,_int>;
  if (&((this->
        super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur)->super_pair<float,_int> != ppVar3) {
    pVar6 = *ppVar3;
    uVar9 = (ulong)pVar6 >> 0x20;
    uVar8 = pVar6.second;
    local_38 = pVar6;
    if (this->use_dense_version == true) {
      local_3c = uVar8;
      iVar4 = std::
              _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->coefficients)._M_h,(key_type_conflict *)&local_3c);
      if (iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur !=
          (__node_type *)0x0) {
        std::
        _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&(this->coefficients)._M_h,
                (const_iterator)
                iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur);
      }
    }
    std::
    priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
    ::pop(&this->
           super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
         );
    pfVar5 = (this->
             super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
             ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    if ((this->
        super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
        ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur == pfVar5) {
      pfVar7 = (filtration_entry_t *)&local_38;
    }
    else {
      pfVar7 = (filtration_entry_t *)&local_38;
      if ((pfVar5->super_pair<float,_int>).second == uVar8) {
        puVar1 = &this->coefficients;
        while( true ) {
          uVar8 = (uint)uVar9;
          if ((this->use_dense_version == true) &&
             (local_3c = uVar8,
             iVar4 = std::
                     _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&puVar1->_M_h,(key_type_conflict *)&local_3c),
             iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur !=
             (__node_type *)0x0)) {
            std::
            _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&puVar1->_M_h,
                    (const_iterator)
                    iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur);
          }
          std::
          priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          ::pop(&this->
                 super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               );
          if ((this->use_dense_version == true) &&
             (ppfVar2 = (this->
                        super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                        ).c.
                        super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                        _M_impl.super__Deque_impl_data._M_finish._M_node,
             pfVar5 = (this->
                      super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                      ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur,
             ((long)(this->
                    super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                    ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                    _M_impl.super__Deque_impl_data._M_start._M_last - (long)pfVar5 >> 3) +
             ((long)(this->
                    super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                    ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->
                    super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                    ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                    _M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppfVar2 -
                       (long)(this->
                             super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                             ).c.
                             super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppfVar2 == (_Map_pointer)0x0)) * 0x40 != 0)) {
            while( true ) {
              local_3c = (pfVar5->super_pair<float,_int>).second;
              iVar4 = std::
                      _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(&puVar1->_M_h,(key_type_conflict *)&local_3c);
              if ((iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur ==
                   (__node_type *)0x0) ||
                 (*(char *)((long)iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>
                                  ._M_cur + 0xc) != '\0')) break;
              std::
              _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::erase(&puVar1->_M_h,
                      (const_iterator)
                      iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur);
              std::
              priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ::pop(&this->
                     super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   );
              pfVar5 = (this->
                       super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                       ).c.
                       super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                       _M_impl.super__Deque_impl_data._M_start._M_cur;
            }
          }
          pfVar5 = (this->
                   super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
          if ((this->
              super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
              ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>._M_impl
              .super__Deque_impl_data._M_finish._M_cur == pfVar5) break;
          pVar6.second = 0;
          pVar6.first = (pfVar5->super_pair<float,_int>).first;
          uVar8 = (pfVar5->super_pair<float,_int>).second;
          uVar9 = (ulong)uVar8;
          if ((this->use_dense_version == true) &&
             (local_3c = uVar8,
             iVar4 = std::
                     _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     ::find(&puVar1->_M_h,(key_type_conflict *)&local_3c),
             iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur !=
             (__node_type *)0x0)) {
            std::
            _Hashtable<int,_std::pair<const_int,_bool>,_std::allocator<std::pair<const_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::erase(&puVar1->_M_h,
                    (const_iterator)
                    iVar4.super__Node_iterator_base<std::pair<const_int,_bool>,_false>._M_cur);
          }
          std::
          priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
          ::pop(&this->
                 super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               );
          pfVar5 = (this->
                   super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
                   ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
                   _M_impl.super__Deque_impl_data._M_start._M_cur;
          if (((this->
               super_priority_queue<filtration_entry_t,_std::deque<filtration_entry_t,_std::allocator<filtration_entry_t>_>,_greater_filtration_or_smaller_index<filtration_entry_t>_>
               ).c.super__Deque_base<filtration_entry_t,_std::allocator<filtration_entry_t>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_cur == pfVar5) ||
             ((pfVar5->super_pair<float,_int>).second != uVar8)) goto LAB_00139281;
        }
        pfVar7 = &dummy;
      }
LAB_00139281:
      local_38 = (pair<float,_int>)((ulong)uVar8 << 0x20);
    }
    local_38.first = pVar6.first;
    pVar6 = pfVar7->super_pair<float,_int>;
  }
  return (filtration_entry_t)pVar6;
}

Assistant:

filtration_entry_t pop_pivot() {
		remove_trivial_coefficient_entries();
		if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
			return dummy;
		else {
			auto pivot = get_top();

#ifdef USE_COEFFICIENTS
			coefficient_t coefficient = 0;
			do {
				coefficient = (coefficient + get_coefficient(get_top())) % modulus;
				safe_pop();
				remove_trivial_coefficient_entries();

				if (coefficient == 0) {
					if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
						return dummy;
					else
						pivot = get_top();
				}
			} while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			         get_index(get_top()) == get_index(pivot));
			if (get_index(pivot) != -1) { set_coefficient(pivot, coefficient); }
#else
			safe_pop();
			while (!std::priority_queue<filtration_entry_t, Container, Comparator>::empty() &&
			       get_index(std::priority_queue<filtration_entry_t, Container, Comparator>::top()) ==
			           get_index(pivot)) {
				safe_pop();
				remove_trivial_coefficient_entries();

				if (std::priority_queue<filtration_entry_t, Container, Comparator>::empty())
					return dummy;
				else {
					pivot = get_top();
					safe_pop();
				}
			}
#endif
			return pivot;
		}
	}